

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O2

void __thiscall MathInterpreter::separateInput(MathInterpreter *this,string *input_arg)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  pointer pcVar4;
  undefined8 *puVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 local_68 [8];
  string temp;
  char *local_40;
  allocator local_31;
  
  temp.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_68,"",&local_31);
  pcVar3 = (input_arg->_M_dataplus)._M_p;
  uVar9 = 0;
  if ((*pcVar3 == '-') && (1 < input_arg->_M_string_length)) {
    uVar7 = 0;
    if ((byte)(pcVar3[1] - 0x30U) < 10) {
      std::__cxx11::string::push_back((char)local_68);
      uVar7 = 0;
      for (uVar9 = 1;
          ((uVar9 < input_arg->_M_string_length &&
           (cVar6 = (input_arg->_M_dataplus)._M_p[uVar9], cVar6 < ':')) &&
          ('/' < cVar6 || cVar6 == '.')); uVar9 = (ulong)((int)uVar9 + 1)) {
        std::__cxx11::string::push_back((char)local_68);
        uVar7 = uVar7 + (cVar6 == '.');
      }
      if (1 < uVar7) {
        local_40 = "Invalid input";
LAB_0010ba83:
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = local_40;
        __cxa_throw(puVar5,&char_const*::typeinfo,0);
      }
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(*(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    **)(temp.field_2._8_8_ + 8),(value_type *)local_68);
      std::__cxx11::string::assign(local_68);
    }
  }
  else {
    uVar7 = 0;
  }
  local_40 = "invalid input_arg2";
  do {
    if (input_arg->_M_string_length <= uVar9) {
      std::__cxx11::string::~string((string *)local_68);
      return;
    }
    pcVar4 = (input_arg->_M_dataplus)._M_p;
    bVar1 = pcVar4[uVar9];
    if ('z' < (char)bVar1) goto LAB_0010ba83;
    uVar8 = (uint)uVar9;
    cVar6 = (char)(value_type *)local_68;
    if ((char)bVar1 < 'a') {
      if ('Z' < (char)bVar1) goto LAB_0010ba83;
      if ('@' < (char)bVar1) goto LAB_0010b88f;
      if ('9' < (char)bVar1) goto LAB_0010ba83;
      if ((char)bVar1 < '0') {
        if ((3 < bVar1 - 0x28) && (bVar1 != 0x2f)) {
          if (bVar1 != 0x2d) goto LAB_0010ba83;
          if (((uVar9 != 0 && (ulong)(uVar8 + 1) < input_arg->_M_string_length) &&
              (pcVar4[uVar8 - 1] == '(')) && ((byte)(pcVar4[uVar8 + 1] - 0x30U) < 10)) {
            std::__cxx11::string::push_back(cVar6);
            std::__cxx11::string::push_back(cVar6);
            uVar8 = uVar8 + 2;
            while (((uVar9 = (ulong)uVar8, uVar9 < input_arg->_M_string_length &&
                    (cVar2 = (input_arg->_M_dataplus)._M_p[uVar9], cVar2 < ':')) &&
                   ('/' < cVar2 || cVar2 == '.'))) {
              std::__cxx11::string::push_back(cVar6);
              uVar7 = uVar7 + (cVar2 == '.');
              uVar8 = uVar8 + 1;
            }
            goto LAB_0010b966;
          }
        }
        std::__cxx11::string::push_back(cVar6);
        uVar9 = (ulong)(uVar8 + 1);
      }
      else {
        std::__cxx11::string::push_back(cVar6);
        while( true ) {
          uVar8 = uVar8 + 1;
          uVar9 = (ulong)uVar8;
          if (((input_arg->_M_string_length <= uVar9) ||
              (cVar2 = (input_arg->_M_dataplus)._M_p[uVar9], '9' < cVar2)) ||
             (cVar2 < '0' && cVar2 != '.')) break;
          uVar7 = uVar7 + (cVar2 == '.');
          std::__cxx11::string::push_back(cVar6);
        }
        if (1 < uVar7) {
          local_40 = "invalid input_arg3";
          goto LAB_0010ba83;
        }
      }
    }
    else {
LAB_0010b88f:
      std::__cxx11::string::push_back(cVar6);
      while( true ) {
        uVar8 = uVar8 + 1;
        uVar9 = (ulong)uVar8;
        if ((input_arg->_M_string_length <= uVar9) ||
           (cVar2 = (input_arg->_M_dataplus)._M_p[uVar9], 'z' < cVar2)) break;
        if (cVar2 < 'a') {
          if (cVar2 < '[') {
            if (9 < (byte)(cVar2 - 0x30U) && cVar2 < 'A') break;
          }
          else if (cVar2 != '_') break;
        }
        std::__cxx11::string::push_back(cVar6);
      }
    }
LAB_0010b966:
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(*(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  **)(temp.field_2._8_8_ + 8),(value_type *)local_68);
    std::__cxx11::string::assign((char *)local_68);
  } while( true );
}

Assistant:

void MathInterpreter::separateInput(string input_arg) {//-rol/70
  string temp = "";
  unsigned int start = 0, count = 0;
  //check negative number in begining of string
  if ((input_arg[start] == '-') && (input_arg.size() > 1)
      && (input_arg[1] <= '9') && (input_arg[1] >= '0')) {
    temp += input_arg[start];
    start++;
    while ((start < input_arg.size())
        && (((input_arg[start] <= '9') && (input_arg[start] >= '0'))
            || (input_arg[start] == '.'))) {
      if (input_arg[start] == '.') {
        count++;
      }
      temp += input_arg[start];
      start++;
    }
    if (count > 1) {
      throw ("Invalid input");
    }
    this->input->push_back(temp);
    temp = "";
  }
  while (start < input_arg.size()) {
    if (((input_arg[start] <= 'z') && (input_arg[start] >= 'a'))
        || ((input_arg[start] <= 'Z') && (input_arg[start] >= 'A'))) {
      temp += input_arg[start];
      start++;
      while (start < input_arg.size()
          && (((input_arg[start] <= 'z') && (input_arg[start] >= 'a'))
              || ((input_arg[start] <= 'Z') && (input_arg[start] >= 'A'))
              || (input_arg[start] == '_')
              || ((input_arg[start] <= '9') && (input_arg[start] >= '0')))) {
        temp += input_arg[start];
        start++;
      }
    } else if ((input_arg[start] <= '9') && (input_arg[start] >= '0')) {
      temp += input_arg[start];
      start++;
      while ((start < input_arg.size())
          && (((input_arg[start] <= '9') && (input_arg[start] >= '0'))
              || (input_arg[start] == '.'))) {
        if (input_arg[start] == '.') {
          count++;
        }
        temp += input_arg[start];
        start++;
      }
      if (count > 1) {
        throw ("invalid input_arg3");
      }
    } else if ((input_arg[start] == '(') || (input_arg[start] == ')')
        || (input_arg[start] == '+') || (input_arg[start] == '-')
        || (input_arg[start] == '*') || (input_arg[start] == '/')) {
      //check for negative number in input_arg
      if ((input_arg[start] == '-') && (input_arg.size() > start + 1)
          && (start > 0) && (input_arg[start - 1] == '(')
          && (input_arg[start + 1] <= '9') && (input_arg[start + 1] >= '0')) {
        temp += (input_arg[start]);
        start++;
        temp += (input_arg[start]);
        start++;
        while ((start < input_arg.size())
            && (((input_arg[start] <= '9') && (input_arg[start] >= '0'))
                || (input_arg[start] == '.'))) {
          if (input_arg[start] == '.') {
            count++;
          }
          temp += input_arg[start];
          start++;
        }
      } else {
        temp += input_arg[start];
        start++;
      }
    } else {
      throw ("invalid input_arg2");
    }
    this->input->push_back(temp);
    temp = "";
  }
}